

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_dup_i64_vec_arm(TCGContext_conflict *tcg_ctx,uint vece,TCGv_vec r,TCGv_i64 a)

{
  uint uVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_arm(tcg_ctx,INDEX_op_dup_vec);
  pTVar2->field_0x1 = (byte)((vece << 0xc) >> 8) | (byte)((uVar1 >> 8) + 0xe00 >> 8) & 0xf;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_dup_i64_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_i64 a)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

#if TCG_TARGET_REG_BITS == 64
        TCGArg ai = tcgv_i64_arg(tcg_ctx, a);
        vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
#else
    if (vece == MO_64) {
        TCGArg al = tcgv_i32_arg(tcg_ctx, TCGV_LOW(tcg_ctx, a));
        TCGArg ah = tcgv_i32_arg(tcg_ctx, TCGV_HIGH(tcg_ctx, a));
        vec_gen_3(tcg_ctx, INDEX_op_dup2_vec, type, MO_64, ri, al, ah);
    } else {
        TCGArg ai = tcgv_i32_arg(tcg_ctx, TCGV_LOW(tcg_ctx, a));
        vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
    }
#endif
}